

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ec_pubkey_tweak_add_helper
              (secp256k1_ecmult_context *ecmult_ctx,secp256k1_ge *p,uchar *tweak)

{
  int iVar1;
  int overflow;
  secp256k1_scalar term;
  secp256k1_gej pt;
  int local_dc;
  secp256k1_scalar local_d8;
  secp256k1_scalar local_b8;
  secp256k1_gej local_98;
  
  local_dc = 0;
  secp256k1_scalar_set_b32(&local_d8,tweak,&local_dc);
  iVar1 = 0;
  if (local_dc == 0) {
    local_98.infinity = p->infinity;
    local_98.x.n[0] = (p->x).n[0];
    local_98.x.n[1] = (p->x).n[1];
    local_98.x.n[2] = (p->x).n[2];
    local_98.x.n[3] = (p->x).n[3];
    local_98.x.n[4] = (p->x).n[4];
    local_98.y.n[0] = (p->y).n[0];
    local_98.y.n[1] = (p->y).n[1];
    local_98.y.n[2] = (p->y).n[2];
    local_98.y.n[3] = (p->y).n[3];
    local_98.y.n[4] = (p->y).n[4];
    local_98.z.n[0] = 1;
    local_98.z.n[1] = 0;
    local_98.z.n[2] = 0;
    local_98.z.n[3] = 0;
    local_98.z.n[4] = 0;
    local_b8.d[0] = 1;
    local_b8.d[1] = 0;
    local_b8.d[2] = 0;
    local_b8.d[3] = 0;
    secp256k1_ecmult(ecmult_ctx,&local_98,&local_98,&local_b8,&local_d8);
    iVar1 = 0;
    if (local_98.infinity == 0) {
      secp256k1_ge_set_gej(p,&local_98);
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

static int secp256k1_ec_pubkey_tweak_add_helper(const secp256k1_ecmult_context* ecmult_ctx, secp256k1_ge *p, const unsigned char *tweak) {
    secp256k1_scalar term;
    int overflow = 0;
    secp256k1_scalar_set_b32(&term, tweak, &overflow);
    return !overflow && secp256k1_eckey_pubkey_tweak_add(ecmult_ctx, p, &term);
}